

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O1

int loop(uchar *pattern,uchar *string,int maxstars)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [4];
  short sVar6;
  int iVar7;
  bool bVar8;
  byte bVar9;
  ulong uVar10;
  uint unaff_EBP;
  byte *pbVar11;
  bool bVar12;
  uchar *pp;
  uchar charset [271];
  undefined1 local_160 [4];
  short sStack_15c;
  undefined2 local_158;
  byte *local_150;
  uchar local_148 [92];
  undefined1 local_ec;
  char local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char local_42;
  char local_41;
  char local_40;
  char local_3f;
  char local_3e;
  
  memset(local_148,0,0x10f);
LAB_0054b165:
  bVar9 = *pattern;
  if (bVar9 < 0x3f) {
    if (bVar9 != 0) {
      if (bVar9 != 0x2a) {
LAB_0054b5a9:
        pattern = pattern + 1;
        pbVar11 = string + 1;
        bVar2 = *string;
        string = pbVar11;
        if (bVar9 == bVar2) goto LAB_0054b5b9;
        unaff_EBP = 1;
        bVar12 = false;
        goto LAB_0054b60b;
      }
      unaff_EBP = 1;
      pbVar11 = string;
      if (maxstars == 0) {
        maxstars = 0;
        goto LAB_0054b608;
      }
      do {
        do {
          bVar9 = pattern[1];
          pattern = pattern + 1;
        } while (bVar9 == 0x2a);
        if (bVar9 == 0) goto LAB_0054b606;
        if (bVar9 != 0x3f) {
          maxstars = maxstars + -1;
          string = pbVar11;
          if (*pbVar11 == 0) goto LAB_0054b608;
          goto LAB_0054b5df;
        }
        string = pbVar11 + 1;
        bVar9 = *pbVar11;
        pbVar11 = string;
      } while (bVar9 != 0);
      goto LAB_0054b601;
    }
    unaff_EBP = (uint)(*string != 0);
    goto LAB_0054b608;
  }
  if (bVar9 == 0x3f) {
    if (*string == 0) {
LAB_0054b5be:
      unaff_EBP = 1;
      goto LAB_0054b608;
    }
    pattern = pattern + 1;
    string = string + 1;
LAB_0054b5b9:
    bVar12 = true;
  }
  else {
    if (bVar9 != 0x5b) {
      if (bVar9 != 0x5c) goto LAB_0054b5a9;
      pbVar11 = pattern + 1;
      if (pattern[1] == 0) {
        pbVar11 = pattern;
      }
      bVar9 = *string;
      string = string + 1;
      pattern = pbVar11 + 1;
      if (bVar9 != *pbVar11) goto LAB_0054b5be;
      goto LAB_0054b5b9;
    }
    iVar7 = 0;
    local_150 = pattern + 1;
    memset(local_148,0,0x10f);
    bVar9 = pattern[1];
    if (bVar9 != 0) {
      bVar12 = false;
      pbVar11 = pattern + 1;
      do {
        if (iVar7 == 2) {
          if (bVar9 != 0x5d) goto LAB_0054b474;
LAB_0054b619:
          bVar9 = *string;
          uVar10 = (ulong)bVar9;
          if (uVar10 == 0) {
LAB_0054b683:
            bVar12 = false;
            unaff_EBP = 1;
          }
          else {
            bVar12 = true;
            if (local_148[uVar10] == '\0') {
              if (local_47 == '\0') {
                if (local_44 == '\0') {
                  if (local_46 == '\0') {
                    if (local_45 == '\0') {
                      if (local_43 == '\0') {
                        if (local_3f == '\0') {
                          if (local_3e != '\0') goto LAB_0054b66b;
                          if (local_41 != '\0') {
                            bVar9 = bVar9 + 0x9f;
                            goto LAB_0054b66e;
                          }
                          if (local_42 == '\0') {
                            if (local_40 == '\0') {
                              bVar12 = false;
                            }
                            else if (4 < (byte)(bVar9 - 9)) {
                              bVar12 = (byte)(bVar9 - 0x21) < 0x5e;
                            }
                          }
                          else {
                            bVar12 = uVar10 == 9 || uVar10 == 0x20;
                          }
                        }
                        else if ((uVar10 != 9) && (bVar9 != 0x20)) {
                          bVar12 = (byte)(bVar9 - 10) < 4;
                        }
                      }
                      else if (4 < (byte)(bVar9 - 9)) {
                        bVar12 = (byte)(bVar9 - 0x20) < 0x5f;
                      }
                    }
                    else if (5 < (byte)(bVar9 + 0x9f) && 9 < (byte)(bVar9 - 0x30)) {
                      bVar12 = (byte)(bVar9 + 0xbf) < 6;
                    }
                  }
                  else {
                    bVar12 = (byte)(bVar9 - 0x30) < 10;
                  }
                }
                else if (0x19 < (byte)(bVar9 + 0x9f)) goto LAB_0054b66b;
              }
              else if (0x19 < (byte)(bVar9 + 0x9f) && 9 < (byte)(bVar9 - 0x30)) {
LAB_0054b66b:
                bVar9 = bVar9 + 0xbf;
LAB_0054b66e:
                bVar12 = bVar9 < 0x1a;
              }
            }
            if ((bool)(local_48 == '\0' ^ bVar12)) goto LAB_0054b683;
            pattern = local_150 + 1;
            string = string + 1;
            bVar12 = true;
          }
          if (bVar12) goto LAB_0054b5b9;
          bVar12 = false;
          goto LAB_0054b60b;
        }
        if (iVar7 == 1) {
          if (bVar9 != 0x5b) {
            if (bVar9 == 0x5d) goto LAB_0054b619;
            iVar7 = 0;
            if ((byte)(bVar9 - 9) < 5 || (byte)(bVar9 - 0x20) < 0x5f) {
              local_148[bVar9] = '\x01';
              local_150 = local_150 + 1;
              goto LAB_0054b582;
            }
            break;
          }
          local_148[bVar9] = '\x01';
          local_150 = local_150 + 1;
          iVar7 = 2;
        }
        else {
          if (iVar7 != 0) goto LAB_0054b582;
          switch(bVar9) {
          case 0x5b:
            if (pbVar11[1] == 0x3a) {
              pbVar11 = pbVar11 + 2;
              local_158 = 0;
              _local_160 = 0;
              uVar10 = 0;
              bVar4 = false;
              bVar12 = false;
              do {
                if (uVar10 < 10) {
                  bVar2 = pbVar11[uVar10];
                  if (bVar12) {
                    bVar12 = true;
                    if (bVar2 != 0x5d) goto LAB_0054b2c9;
                    bVar4 = true;
                    bVar8 = true;
                  }
                  else if ((byte)(bVar2 + 0x9f) < 0x1a) {
                    local_160[uVar10] = bVar2;
                    bVar8 = false;
                  }
                  else {
                    bVar12 = false;
                    bVar3 = false;
                    bVar8 = true;
                    if (bVar2 != 0x3a) goto LAB_0054b2f9;
                  }
                  bVar12 = bVar8;
                  bVar3 = true;
                }
                else {
LAB_0054b2c9:
                  bVar3 = false;
                }
LAB_0054b2f9:
                bVar8 = true;
                if (!bVar3) goto LAB_0054b567;
                uVar10 = uVar10 + 1;
              } while (!bVar4);
              auVar5 = local_160;
              sVar6 = sStack_15c;
              pbVar11 = pbVar11 + uVar10;
              if (sStack_15c == 0x74 && local_160 == (undefined1  [4])0x69676964) {
                local_46 = '\x01';
LAB_0054b565:
                bVar8 = false;
              }
              else {
                if (sStack_15c == 0x6d && local_160 == (undefined1  [4])0x756e6c61) {
                  local_47 = '\x01';
                  goto LAB_0054b565;
                }
                if (sStack_15c == 0x61 && local_160 == (undefined1  [4])0x68706c61) {
                  local_44 = '\x01';
                  goto LAB_0054b565;
                }
                if (stack0xfffffffffffffea3 == 0x746967 && auVar5 == (undefined1  [4])0x67696478) {
                  local_45 = '\x01';
                  goto LAB_0054b565;
                }
                if (sVar6 == 0x74 && auVar5 == (undefined1  [4])0x6e697270) {
                  local_43 = '\x01';
                  goto LAB_0054b565;
                }
                if (sVar6 == 0x68 && auVar5 == (undefined1  [4])0x70617267) {
                  local_40 = '\x01';
                  goto LAB_0054b565;
                }
                if (sVar6 == 0x65 && auVar5 == (undefined1  [4])0x63617073) {
                  local_3f = '\x01';
                  goto LAB_0054b565;
                }
                if (sVar6 == 0x6b && auVar5 == (undefined1  [4])0x6e616c62) {
                  local_42 = '\x01';
                  goto LAB_0054b565;
                }
                if (sVar6 == 0x72 && auVar5 == (undefined1  [4])0x65707075) {
                  local_3e = '\x01';
                  goto LAB_0054b565;
                }
                if (sVar6 == 0x72 && auVar5 == (undefined1  [4])0x65776f6c) {
                  local_41 = '\x01';
                  goto LAB_0054b565;
                }
              }
LAB_0054b567:
              if (!bVar8) break;
            }
            local_148[bVar9] = '\x01';
            pbVar11 = local_150 + 1;
            break;
          case 0x5c:
            local_150 = pbVar11 + 1;
            if (pbVar11[1] == 0) {
              local_ec = 1;
              pbVar11 = local_150;
            }
            else {
LAB_0054b4c5:
              setcharorrange(&local_150,local_148);
              pbVar11 = local_150;
            }
            break;
          case 0x5d:
            if (bVar12) goto LAB_0054b619;
            local_150 = local_150 + 1;
            local_148[bVar9] = '\x01';
            bVar12 = true;
            iVar7 = 1;
            goto LAB_0054b582;
          case 0x5e:
            goto switchD_0054b27d_caseD_5e;
          default:
            if (bVar9 != 0x21) goto LAB_0054b4c5;
            goto switchD_0054b27d_caseD_5e;
          }
          local_150 = pbVar11;
          bVar12 = true;
LAB_0054b57f:
          iVar7 = 0;
        }
LAB_0054b582:
        bVar9 = *local_150;
        pbVar11 = local_150;
      } while (bVar9 != 0);
    }
    bVar12 = false;
    unaff_EBP = 1;
  }
  goto LAB_0054b60b;
  while (string = pbVar11 + 1, pbVar1 = pbVar11 + 1, pbVar11 = string, *pbVar1 != 0) {
LAB_0054b5df:
    iVar7 = loop(pattern,pbVar11,maxstars);
    if (iVar7 == 0) goto LAB_0054b606;
  }
LAB_0054b601:
  bVar12 = false;
  goto LAB_0054b60b;
LAB_0054b606:
  unaff_EBP = 0;
  string = pbVar11;
LAB_0054b608:
  bVar12 = false;
LAB_0054b60b:
  if (!bVar12) {
    return unaff_EBP;
  }
  goto LAB_0054b165;
switchD_0054b27d_caseD_5e:
  if (bVar12) {
LAB_0054b474:
    local_148[bVar9] = '\x01';
  }
  else if (local_48 == '\0') {
    local_48 = '\x01';
  }
  else {
    local_148[bVar9] = '\x01';
    bVar12 = true;
  }
  local_150 = local_150 + 1;
  goto LAB_0054b57f;
}

Assistant:

static int loop(const unsigned char *pattern, const unsigned char *string,
                int maxstars)
{
  unsigned char *p = (unsigned char *)pattern;
  unsigned char *s = (unsigned char *)string;
  unsigned char charset[CURLFNM_CHSET_SIZE] = { 0 };

  for(;;) {
    unsigned char *pp;

    switch(*p) {
    case '*':
      if(!maxstars)
        return CURL_FNMATCH_NOMATCH;
      /* Regroup consecutive stars and question marks. This can be done because
         '*?*?*' can be expressed as '??*'. */
      for(;;) {
        if(*++p == '\0')
          return CURL_FNMATCH_MATCH;
        if(*p == '?') {
          if(!*s++)
            return CURL_FNMATCH_NOMATCH;
        }
        else if(*p != '*')
          break;
      }
      /* Skip string characters until we find a match with pattern suffix. */
      for(maxstars--; *s; s++) {
        if(loop(p, s, maxstars) == CURL_FNMATCH_MATCH)
          return CURL_FNMATCH_MATCH;
      }
      return CURL_FNMATCH_NOMATCH;
    case '?':
      if(!*s)
        return CURL_FNMATCH_NOMATCH;
      s++;
      p++;
      break;
    case '\0':
      return *s? CURL_FNMATCH_NOMATCH: CURL_FNMATCH_MATCH;
    case '\\':
      if(p[1])
        p++;
      if(*s++ != *p++)
        return CURL_FNMATCH_NOMATCH;
      break;
    case '[':
      pp = p + 1; /* Copy in case of syntax error in set. */
      if(setcharset(&pp, charset)) {
        int found = FALSE;
        if(!*s)
          return CURL_FNMATCH_NOMATCH;
        if(charset[(unsigned int)*s])
          found = TRUE;
        else if(charset[CURLFNM_ALNUM])
          found = ISALNUM(*s);
        else if(charset[CURLFNM_ALPHA])
          found = ISALPHA(*s);
        else if(charset[CURLFNM_DIGIT])
          found = ISDIGIT(*s);
        else if(charset[CURLFNM_XDIGIT])
          found = ISXDIGIT(*s);
        else if(charset[CURLFNM_PRINT])
          found = ISPRINT(*s);
        else if(charset[CURLFNM_SPACE])
          found = ISSPACE(*s);
        else if(charset[CURLFNM_UPPER])
          found = ISUPPER(*s);
        else if(charset[CURLFNM_LOWER])
          found = ISLOWER(*s);
        else if(charset[CURLFNM_BLANK])
          found = ISBLANK(*s);
        else if(charset[CURLFNM_GRAPH])
          found = ISGRAPH(*s);

        if(charset[CURLFNM_NEGATE])
          found = !found;

        if(!found)
          return CURL_FNMATCH_NOMATCH;
        p = pp + 1;
        s++;
        break;
      }
      /* Syntax error in set; mismatch! */
      return CURL_FNMATCH_NOMATCH;

    default:
      if(*p++ != *s++)
        return CURL_FNMATCH_NOMATCH;
      break;
    }
  }
}